

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_set.c
# Opt level: O1

void set_destroy(set s)

{
  void *__ptr;
  long lVar1;
  ulong uVar2;
  
  if (s != (set)0x0) {
    if (s->buckets != (bucket)0x0) {
      if (s->capacity != 0) {
        lVar1 = 0x10;
        uVar2 = 0;
        do {
          __ptr = *(void **)((long)&s->buckets->count + lVar1);
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
          uVar2 = uVar2 + 1;
          lVar1 = lVar1 + 0x18;
        } while (uVar2 < s->capacity);
      }
      free(s->buckets);
    }
    free(s);
    return;
  }
  return;
}

Assistant:

void set_destroy(set s)
{
	if (s == NULL)
	{
		return;
	}

	if (s->buckets != NULL)
	{
		size_t iterator;

		for (iterator = 0; iterator < s->capacity; ++iterator)
		{
			bucket b = &s->buckets[iterator];

			if (b->pairs != NULL)
			{
				free(b->pairs);
			}
		}

		free(s->buckets);
	}

	free(s);
}